

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::Int32ToString_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,int number)

{
  SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,number);
  return __return_storage_ptr__;
}

Assistant:

string Int32ToString(int number) {
  // gcc rejects the decimal form of kint32min.
  if (number == kint32min) {
    GOOGLE_COMPILE_ASSERT(kint32min == (~0x7fffffff), kint32min_value_error);
    return "(~0x7fffffff)";
  } else {
    return SimpleItoa(number);
  }
}